

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall
DStrifeStatusBar::DrINumber2(DStrifeStatusBar *this,int val,int x,int y,int width,int imgBase)

{
  DFrameBuffer *pDVar1;
  FTexture *pFVar2;
  int imgBase_local;
  int width_local;
  int y_local;
  int x_local;
  int val_local;
  DStrifeStatusBar *this_local;
  
  pDVar1 = screen;
  width_local = x - width;
  y_local = val;
  if (val == 0) {
    pFVar2 = FImageCollection::operator[](&this->Images,imgBase);
    DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)width_local,(double)y,0x40001393,1,0);
  }
  else {
    for (; pDVar1 = screen, y_local != 0; y_local = y_local / 10) {
      pFVar2 = FImageCollection::operator[](&this->Images,imgBase + y_local % 10);
      DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)width_local,(double)y,0x40001393,1,0);
      width_local = width_local - width;
    }
  }
  return;
}

Assistant:

void DrINumber2 (signed int val, int x, int y, int width, int imgBase) const
	{
		x -= width;

		if (val == 0)
		{
			screen->DrawTexture (Images[imgBase], x, y, DTA_CleanNoMove, true, TAG_DONE);
		}
		else
		{
			while (val != 0)
			{
				screen->DrawTexture (Images[imgBase+val%10], x, y, DTA_CleanNoMove, true, TAG_DONE);
				val /= 10;
				x -= width;
			}
		}
	}